

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

int pem_write_bio_RSA_PUBKEY_i2d(void *x,uchar **outp)

{
  int iVar1;
  uchar **outp_local;
  void *x_local;
  
  iVar1 = i2d_RSA_PUBKEY((RSA *)x,outp);
  return iVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}